

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O3

string * muduo::ProcessInfo::exePath_abi_cxx11_(void)

{
  ssize_t sVar1;
  string *in_RDI;
  char buf [1024];
  char acStack_418 [1024];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  sVar1 = readlink("/proc/self/exe",acStack_418,0x400);
  if (0 < sVar1) {
    std::__cxx11::string::_M_replace
              ((ulong)in_RDI,0,(char *)in_RDI->_M_string_length,(ulong)acStack_418);
  }
  return in_RDI;
}

Assistant:

string ProcessInfo::exePath()
{
  string result;
  char buf[1024];
  ssize_t n = ::readlink("/proc/self/exe", buf, sizeof buf);
  if (n > 0)
  {
    result.assign(buf, n);
  }
  return result;
}